

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O1

bool __thiscall ON_3dmSettings::Write_v2(ON_3dmSettings *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ON__INT32 OVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  
  iVar4 = ON_BinaryArchive::Archive3dmVersion(file);
  bVar1 = true;
  if (((3 < iVar4) && (0 < (this->m_plugin_list).m_count)) &&
     (bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x20008135,0), bVar1)) {
    bVar2 = ON_BinaryArchive::Write3dmChunkVersion(file,1,0);
    if (bVar2) {
      bVar2 = ON_BinaryArchive::WriteInt(file,(this->m_plugin_list).m_count);
    }
    if ((bVar2 != false) && (0 < (this->m_plugin_list).m_count)) {
      lVar6 = 0;
      lVar8 = 1;
      do {
        bVar2 = ON_PlugInRef::Write((ON_PlugInRef *)
                                    ((((this->m_plugin_list).m_a)->m_plugin_id).Data4 + lVar6 + -8),
                                    file);
        if (!bVar2) break;
        lVar6 = lVar6 + 0x78;
        bVar1 = lVar8 < (this->m_plugin_list).m_count;
        lVar8 = lVar8 + 1;
      } while (bVar1);
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    bVar1 = (bool)(bVar1 & bVar2);
  }
  if ((bVar1 != false) && (bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x20008031,0), bVar1))
  {
    bVar2 = ON_3dmUnitsAndTolerances::Write(&this->m_ModelUnitsAndTolerances,file);
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    bVar1 = bVar1 && bVar2;
  }
  if ((bVar1 != false) && (bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x20008032,0), bVar1))
  {
    bVar2 = ON_MeshParameters::Write(&this->m_RenderMeshSettings,file);
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    bVar1 = bVar1 && bVar2;
  }
  if ((bVar1 != false) && (bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x20008033,0), bVar1))
  {
    bVar2 = ON_MeshParameters::Write(&this->m_AnalysisMeshSettings,file);
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    bVar1 = bVar1 && bVar2;
  }
  if ((bVar1 != false) && (bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x20008034,0), bVar1))
  {
    bVar2 = ON_3dmAnnotationSettings::Write(&this->m_AnnotationSettings,file);
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    bVar1 = bVar1 && bVar2;
  }
  if ((bVar1 != false) && (bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x20008035,0), bVar1))
  {
    iVar4 = (this->m_named_cplanes).m_count;
    bVar2 = ON_BinaryArchive::WriteInt(file,iVar4);
    if (bVar2 && 0 < (long)iVar4) {
      lVar8 = 0;
      uVar7 = 1;
      do {
        bVar2 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x2000813b,0);
        if (bVar2) {
          bVar1 = ON_3dmConstructionPlane::Write
                            ((ON_3dmConstructionPlane *)
                             ((long)&(((this->m_named_cplanes).m_a)->m_plane).origin.x + lVar8),file
                            );
          bVar2 = ON_BinaryArchive::EndWrite3dmChunk(file);
          bVar2 = bVar2 && bVar1;
        }
        if (bVar2 == false) break;
        lVar8 = lVar8 + 0xa8;
        bVar1 = uVar7 < (ulong)(long)iVar4;
        uVar7 = uVar7 + 1;
      } while (bVar1);
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    bVar1 = (bool)(bVar1 & bVar2);
  }
  if ((bVar1 != false) && (bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x20008036,0), bVar1))
  {
    iVar4 = (this->m_named_views).m_count;
    bVar2 = ON_BinaryArchive::WriteInt(file,iVar4);
    if (bVar2 && 0 < (long)iVar4) {
      lVar8 = 0;
      uVar7 = 1;
      do {
        bVar2 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x2000803b,0);
        if (bVar2) {
          bVar1 = ON_3dmView::Write((ON_3dmView *)
                                    ((long)&(((this->m_named_views).m_a)->m_vp).super_ON_Geometry.
                                            super_ON_Object._vptr_ON_Object + lVar8),file);
          bVar2 = ON_BinaryArchive::EndWrite3dmChunk(file);
          bVar2 = bVar2 && bVar1;
        }
        if (bVar2 == false) break;
        lVar8 = lVar8 + 0x5f0;
        bVar1 = uVar7 < (ulong)(long)iVar4;
        uVar7 = uVar7 + 1;
      } while (bVar1);
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    bVar1 = (bool)(bVar1 & bVar2);
  }
  if ((bVar1 != false) && (bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x20008037,0), bVar1))
  {
    iVar4 = (this->m_views).m_count;
    bVar2 = ON_BinaryArchive::WriteInt(file,iVar4);
    if (bVar2 && 0 < (long)iVar4) {
      lVar8 = 0;
      uVar7 = 1;
      do {
        bVar2 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x2000803b,0);
        if (bVar2) {
          bVar1 = ON_3dmView::Write((ON_3dmView *)
                                    ((long)&(((this->m_views).m_a)->m_vp).super_ON_Geometry.
                                            super_ON_Object._vptr_ON_Object + lVar8),file);
          bVar2 = ON_BinaryArchive::EndWrite3dmChunk(file);
          bVar2 = bVar2 && bVar1;
        }
        if (bVar2 == false) break;
        lVar8 = lVar8 + 0x5f0;
        bVar1 = uVar7 < (ulong)(long)iVar4;
        uVar7 = uVar7 + 1;
      } while (bVar1);
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    bVar1 = (bool)(bVar1 & bVar2);
  }
  if (bVar1 != false) {
    iVar4 = 0;
    if (0 < this->m_V5_current_layer_index) {
      iVar4 = this->m_V5_current_layer_index;
    }
    bVar2 = ON_BinaryArchive::BeginWrite3dmChunk(file,0xa0000038,iVar4);
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    bVar1 = bVar1 && bVar2;
  }
  if ((bVar1 != false) && (bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x20008039,0), bVar1))
  {
    OVar5 = -1;
    if (-1 < this->m_V5_current_render_material_index) {
      OVar5 = this->m_V5_current_render_material_index;
    }
    bVar2 = ON_BinaryArchive::WriteInt(file,OVar5);
    if (bVar2) {
      bVar2 = ON_BinaryArchive::WriteInt(file,this->m_current_material_source);
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    bVar1 = (bool)(bVar1 & bVar2);
  }
  if ((bVar1 != false) && (bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x2000803a,0), bVar1))
  {
    bVar2 = ON_BinaryArchive::WriteColor(file,&this->m_current_color);
    if (bVar2) {
      bVar2 = ON_BinaryArchive::WriteInt(file,this->m_current_color_source);
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    bVar1 = (bool)(bVar1 & bVar2);
  }
  if ((bVar1 != false) &&
     (bVar2 = ON_BinaryArchive::BeginWrite3dmChunk(file,0xa000003c,this->m_current_wire_density),
     bVar1 = bVar2, bVar2)) {
    bVar3 = ON_BinaryArchive::EndWrite3dmChunk(file);
    bVar1 = false;
    if (bVar3) {
      bVar1 = bVar2;
    }
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x2000803d,0);
    if (bVar1) {
      bVar2 = ON_3dmRenderSettings::Write(&this->m_RenderSettings,file);
      bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
      bVar1 = bVar1 && bVar2;
    }
    if ((bVar1 != false) && (iVar4 = ON_BinaryArchive::Archive3dmVersion(file), 0x3b < iVar4)) {
      bVar2 = ON_BinaryArchive::ObjectHasUserDataToWrite
                        (file,&(this->m_RenderSettings).super_ON_Object);
      if ((bVar2) && (bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x20008136,0), bVar1)) {
        bVar1 = ON_BinaryArchive::WriteObjectUserData
                          (file,&(this->m_RenderSettings).super_ON_Object);
        bVar2 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x80027fff,0);
        bVar3 = false;
        if (bVar2) {
          bVar3 = ON_BinaryArchive::EndWrite3dmChunk(file);
          bVar3 = bVar1 && bVar3;
        }
        bVar2 = ON_BinaryArchive::EndWrite3dmChunk(file);
        bVar1 = false;
        if (bVar2) {
          bVar1 = bVar3;
        }
      }
    }
  }
  if ((bVar1 != false) && (bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x2000803f,0), bVar1))
  {
    bVar2 = ON_3dmConstructionPlaneGridDefaults::Write(&this->m_GridDefaults,file);
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    bVar1 = bVar1 && bVar2;
  }
  if (((bVar1 != false) && (iVar4 = ON_wString::Length(&this->m_model_URL), 0 < iVar4)) &&
     (bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x20008131,0), bVar1)) {
    bVar2 = ON_BinaryArchive::WriteString(file,&this->m_model_URL);
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    bVar1 = bVar1 && bVar2;
  }
  if (bVar1 != false) {
    iVar4 = 0;
    if (0 < this->m_V5_current_text_style_index) {
      iVar4 = this->m_V5_current_text_style_index;
    }
    bVar2 = ON_BinaryArchive::BeginWrite3dmChunk(file,0xa0000132,iVar4);
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    bVar1 = bVar1 && bVar2;
  }
  if (bVar1 != false) {
    iVar4 = 0;
    if (0 < this->m_V5_current_dimension_style_index) {
      iVar4 = this->m_V5_current_dimension_style_index;
    }
    bVar2 = ON_BinaryArchive::BeginWrite3dmChunk(file,0xa0000133,iVar4);
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    bVar1 = bVar1 && bVar2;
  }
  if (((bVar1 != false) && (iVar4 = ON_BinaryArchive::Archive3dmVersion(file), 3 < iVar4)) &&
     (bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x20008134,0), bVar1)) {
    ON_BinaryArchive::Write3dmChunkVersion(file,1,7);
    bVar2 = ON_BinaryArchive::WriteDouble(file,this->m_linetype_display_scale);
    if (((bVar2) && (bVar2 = ON_BinaryArchive::WriteColor(file,&this->m_current_plot_color), bVar2))
       && (bVar2 = ON_BinaryArchive::WriteInt(file,this->m_current_plot_color_source), bVar2)) {
      OVar5 = -1;
      if (-1 < this->m_V5_current_line_pattern_index) {
        OVar5 = this->m_V5_current_line_pattern_index;
      }
      bVar2 = ON_BinaryArchive::WriteInt(file,OVar5);
      if ((bVar2) &&
         (bVar2 = ON_BinaryArchive::WriteInt(file,this->m_current_linetype_source), bVar2)) {
        bVar2 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,0);
        if (bVar2) {
          bVar1 = ON_3dmUnitsAndTolerances::Write(&this->m_PageUnitsAndTolerances,file);
          bVar2 = ON_BinaryArchive::EndWrite3dmChunk(file);
          bVar2 = bVar2 && bVar1;
        }
        if (((((((bVar2 != false) &&
                (bVar2 = ON_BinaryArchive::WriteUuid(file,&this->m_active_view_id), bVar2)) &&
               (bVar2 = ON_BinaryArchive::WritePoint(file,&this->m_model_basepoint), bVar2)) &&
              ((bVar2 = ON_EarthAnchorPoint::Write(&this->m_earth_anchor_point,file), bVar2 &&
               (bVar2 = ON_BinaryArchive::WriteBool
                                  (file,(this->m_IO_settings).m_bSaveTextureBitmapsInFile), bVar2)))
              ) && ((bVar2 = ON_3dmIOSettings::Write(&this->m_IO_settings,file), bVar2 &&
                    ((bVar2 = ON_MeshParameters::Write(&this->m_CustomRenderMeshSettings,file),
                     bVar2 && (bVar2 = ON_BinaryArchive::WriteUuid(file,&this->m_current_layer_id),
                              bVar2)))))) &&
            (bVar2 = ON_BinaryArchive::WriteUuid(file,&this->m_current_render_material_id), bVar2))
           && (((bVar2 = ON_BinaryArchive::WriteUuid(file,&this->m_current_line_pattern_id), bVar2
                && (bVar2 = ON_BinaryArchive::WriteUuid(file,&this->m_current_text_style_id), bVar2)
                ) && (bVar2 = ON_BinaryArchive::WriteUuid(file,&this->m_current_dimension_style_id),
                     bVar2)))) {
          bVar2 = ON_BinaryArchive::WriteUuid(file,&this->m_current_hatch_pattern_id);
        }
      }
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    bVar1 = (bool)(bVar1 & bVar2);
  }
  if (bVar1 != false) {
    bVar2 = ON_BinaryArchive::BeginWrite3dmChunk(file,0xffffffff,0);
    bVar1 = bVar2;
    if ((bVar2) && (bVar3 = ON_BinaryArchive::EndWrite3dmChunk(file), bVar1 = false, bVar3)) {
      bVar1 = bVar2;
    }
  }
  return bVar1;
}

Assistant:

bool ON_3dmSettings::Write_v2(ON_BinaryArchive& file) const
{
  int i;
  bool rc = true;

  // TCODE_SETTINGS_PLUGINLIST - plugins that may have saved userdata in the file
  if (rc && file.Archive3dmVersion() >= 4 && m_plugin_list.Count() > 0 )
  {
    // The plug-in list chunk needs to be first, so the plug-ins that save
    // userdata on views can be loaded as needed.
    rc = file.BeginWrite3dmChunk(TCODE_SETTINGS_PLUGINLIST,0);
    if ( rc ) 
    {
      if (rc) rc = file.Write3dmChunkVersion(1,0);
      if (rc) rc = file.WriteInt( m_plugin_list.Count() );
      for ( i = 0; rc && i < m_plugin_list.Count(); i++ )
      {
        rc = m_plugin_list[i].Write(file);
      }

      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  // TCODE_PROPERTIES_UNITSANDTOLS - units and tolerances
  if ( rc  ) {
    rc = file.BeginWrite3dmChunk(TCODE_SETTINGS_UNITSANDTOLS,0);
    if ( rc ) {
      rc = m_ModelUnitsAndTolerances.Write(file);
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  // TCODE_SETTINGS_RENDERMESH - rendering defaults
  if ( rc  ) {
    rc = file.BeginWrite3dmChunk(TCODE_SETTINGS_RENDERMESH,0);
    if ( rc ) {
      rc = m_RenderMeshSettings.Write(file);
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  // TCODE_SETTINGS_ANALYSISMESH - analysis mesh defaults
  if ( rc  ) {
    rc = file.BeginWrite3dmChunk(TCODE_SETTINGS_ANALYSISMESH,0);
    if ( rc ) {
      rc = m_AnalysisMeshSettings.Write(file);
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  // TCODE_SETTINGS_ANNOTATION - annotation settings
  if ( rc  ) {
    rc = file.BeginWrite3dmChunk(TCODE_SETTINGS_ANNOTATION,0);
    if ( rc ) {
      rc = m_AnnotationSettings.Write(file);
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  // TCODE_SETTINGS_NAMED_CPLANE_LIST
  if ( rc  ) {
    rc = file.BeginWrite3dmChunk(TCODE_SETTINGS_NAMED_CPLANE_LIST,0);
    if ( rc ) {
      const int count = m_named_cplanes.Count();
      rc = file.WriteInt(count);
      for ( i = 0; i < count && rc; i++ ) {
        rc = file.BeginWrite3dmChunk( TCODE_VIEW_CPLANE, 0 );
        if (rc ) {
          rc = m_named_cplanes[i].Write(file);
          if ( !file.EndWrite3dmChunk() )
            rc = false;
        }
      }
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  // TCODE_SETTINGS_NAMED_VIEW_LIST
  if ( rc  ) {
    rc = file.BeginWrite3dmChunk(TCODE_SETTINGS_NAMED_VIEW_LIST,0);
    if ( rc ) {
      const int count = m_named_views.Count();
      rc = file.WriteInt(count);
      for ( i = 0; i < count && rc; i++ ) {
        rc = file.BeginWrite3dmChunk( TCODE_VIEW_RECORD, 0 );
        if (rc ) {
          rc = m_named_views[i].Write(file);
          if ( !file.EndWrite3dmChunk() )
            rc = false;
        }
      }
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  // TCODE_SETTINGS_VIEW_LIST
  if ( rc  ) {
    rc = file.BeginWrite3dmChunk(TCODE_SETTINGS_VIEW_LIST,0);
    if ( rc ) {
      const int count = m_views.Count();
      rc = file.WriteInt(count);
      for ( i = 0; i < count && rc; i++ ) {
        rc = file.BeginWrite3dmChunk( TCODE_VIEW_RECORD, 0 );
        if (rc ) {
          rc = m_views[i].Write(file);
          if ( !file.EndWrite3dmChunk() )
            rc = false;
        }
      }
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  // TCODE_SETTINGS_CURRENT_LAYER_INDEX
  if (rc) {
    int V5_index = m_V5_current_layer_index >= 0 ? m_V5_current_layer_index : 0;
    rc = file.BeginWrite3dmChunk( TCODE_SETTINGS_CURRENT_LAYER_INDEX, V5_index );
    if ( !file.EndWrite3dmChunk() )
      rc = false;
  }

  // TCODE_SETTINGS_CURRENT_MATERIAL_INDEX
  if (rc) {
    rc = file.BeginWrite3dmChunk( TCODE_SETTINGS_CURRENT_MATERIAL_INDEX, 0 );
    if (rc) {
      int V5_index = m_V5_current_render_material_index >= 0 ? m_V5_current_render_material_index : -1;
      rc = file.WriteInt( V5_index );
      i = m_current_material_source;
      if (rc) rc = file.WriteInt( i );
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  // TCODE_SETTINGS_CURRENT_COLOR
  if (rc) {
    rc = file.BeginWrite3dmChunk( TCODE_SETTINGS_CURRENT_COLOR, 0 );
    if (rc) {
      rc = file.WriteColor( m_current_color );
      i = m_current_color_source;
      if (rc) rc = file.WriteInt( i );
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }


  // TCODE_SETTINGS_CURRENT_WIRE_DENSITY
  if (rc) {
    rc = file.BeginWrite3dmChunk( TCODE_SETTINGS_CURRENT_WIRE_DENSITY, m_current_wire_density );
    if (rc) {
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  // TCODE_SETTINGS_RENDER
  if (rc) 
  {
    rc = file.BeginWrite3dmChunk( TCODE_SETTINGS_RENDER, 0 );
    if (rc) 
    {
      rc = m_RenderSettings.Write(file)?true:false;
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
    if (rc && file.Archive3dmVersion() >= 60 && file.ObjectHasUserDataToWrite(&m_RenderSettings) )
    {
      // 2016-Nov-28 RH-33298 Dale Lear
      // ON_3dmRenderSettings user data in ON_3dmSettings
      //   I added support for saving userdata attached to the m_RenderSettings ON_3dmRenderSettings.
      //   Ideally, the ON_3dmRenderSettings would be read by calling file.WriteObject(), but
      //   userdata support is being added years after millions of files have been written by calling
      //   ON_3dmRenderSettings.Write()/Read().
      rc = file.BeginWrite3dmChunk( TCODE_SETTINGS_RENDER_USERDATA, 0 );
      if(rc) 
      {
        rc = file.WriteObjectUserData(m_RenderSettings);
        // write a "fake" TCODE_OPENNURBS_CLASS_END end of class mark so I can use
        // ON_BinaryArchive::ReadObjectUserData() to read the m_RenderSettings user data.
        if ( file.BeginWrite3dmChunk( TCODE_OPENNURBS_CLASS_END, 0 ) ) 
        {
          if ( !file.EndWrite3dmChunk() )
            rc = false;
        }
        else
        {
          rc = false;
        }
        if ( !file.EndWrite3dmChunk() ) // end of TCODE_SETTINGS_RENDER_USERDATA
          rc = false;
      }
    }
  }

  // TCODE_SETTINGS_GRID_DEFAULTS
  if (rc) {
    rc = file.BeginWrite3dmChunk( TCODE_SETTINGS_GRID_DEFAULTS, 0 );
    if (rc) {
      rc = m_GridDefaults.Write(file);
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  // TCODE_SETTINGS_MODEL_URL - added 21 June 2001
  if (rc && m_model_URL.Length() > 0 ) {
    rc = file.BeginWrite3dmChunk( TCODE_SETTINGS_MODEL_URL, 0 );
    if (rc) {
      rc = file.WriteString(m_model_URL);
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  // TCODE_SETTINGS_CURRENT_FONT_INDEX - added 10 June 2002
  if (rc) {
    int V5_index = m_V5_current_text_style_index >= 0 ? m_V5_current_text_style_index : 0;
    rc = file.BeginWrite3dmChunk( TCODE_SETTINGS_CURRENT_FONT_INDEX, V5_index );
    if ( !file.EndWrite3dmChunk() )
      rc = false;
  }
    
  // TCODE_SETTINGS_CURRENT_DIMSTYLE_INDEX - added 10 June 2002
  if (rc) {
    int V5_index = m_V5_current_dimension_style_index >= 0 ? m_V5_current_dimension_style_index : 0;
    rc = file.BeginWrite3dmChunk( TCODE_SETTINGS_CURRENT_DIMSTYLE_INDEX, V5_index );
    if ( !file.EndWrite3dmChunk() )
      rc = false;
  }

  // TCODE_SETTINGS_ATTRIBUTES
  if (rc && file.Archive3dmVersion() >= 4 )
  {
    // 23 March 2005 Dale Lear
    rc = file.BeginWrite3dmChunk(TCODE_SETTINGS_ATTRIBUTES, 0 );
    if (rc)
    {
      for(;;)
      {
        // 1.0 - 23 March 2005
        // 1.1 -  6 Feb   2006
        // 1.2 -  1 March 2006
        // 1.3 - 29 March 2006
        // 1.4 - 18 April 2006
        // 1.5 - 21 April 2006
        // 1.6 -  7 June  2006
        // 1.7 - 30 September 2015
        rc = file.Write3dmChunkVersion(1,7);

        // version 1.0 fields 
        rc = file.WriteDouble( m_linetype_display_scale );
        if (!rc) break;

        rc = file.WriteColor(m_current_plot_color);
        if (!rc) break;

        rc = file.WriteInt(m_current_plot_color_source);
        if (!rc) break;

        int V5_index = m_V5_current_line_pattern_index >= 0 ? m_V5_current_line_pattern_index : -1;
        rc = file.WriteInt(V5_index);
        if (!rc) break;

        rc = file.WriteInt(m_current_linetype_source);
        if (!rc) break;

        // 6 Feb 2006, 1.1 fields

        // the units and tols has to be inside a chunk
        rc = file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0);
        if (rc)
        {
          rc = m_PageUnitsAndTolerances.Write(file);
          if ( !file.EndWrite3dmChunk() )
            rc = false;
        }
        if (!rc) break;

        // 1 Mar 2006 1.2 fields
        rc = file.WriteUuid(m_active_view_id);
        if (!rc) break;

        // 29 March 2006 1.3 fields
        rc = file.WritePoint( m_model_basepoint);
        if (!rc) break;
        rc = m_earth_anchor_point.Write(file);
        if (!rc) break;

        // 18 April 2006 1.4 fields
        rc = file.WriteBool(m_IO_settings.m_bSaveTextureBitmapsInFile);
        if (!rc) break;

        // 21 April 2006 1.5 fields
        rc = m_IO_settings.Write(file);
        if (!rc) break;

        // 7 June 2006 1.6 fields
        rc = m_CustomRenderMeshSettings.Write(file);
        if (!rc) break;

        // 1.7 - 30 September 2015
        //  switching from indices to ids
        rc = file.WriteUuid(m_current_layer_id);
        if (!rc) break;
        rc = file.WriteUuid(m_current_render_material_id);
        if (!rc) break;
        rc = file.WriteUuid(m_current_line_pattern_id);
        if (!rc) break;
        rc = file.WriteUuid(m_current_text_style_id);
        if (!rc) break;
        rc = file.WriteUuid(m_current_dimension_style_id);
        if (!rc) break;
        rc = file.WriteUuid(m_current_hatch_pattern_id);
        if (!rc) break;

        break;
      }

      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  // required TCODE_ENDOFTABLE chunk - marks end of settings table
  if ( rc ) {
    rc = file.BeginWrite3dmChunk( TCODE_ENDOFTABLE, 0 );
    if ( rc ) {
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }


  return rc;
}